

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setHandleOption
          (CommonCore *this,InterfaceHandle handle,int32_t option,int32_t option_value)

{
  uint16_t uVar1;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var2;
  int in_ECX;
  undefined4 in_ESI;
  FederateState *fed;
  ActionMessage fcn;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *handleInfo;
  undefined4 in_stack_fffffffffffffed8;
  int32_t in_stack_fffffffffffffedc;
  FederateState *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef8;
  action_t in_stack_fffffffffffffefc;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_stack_ffffffffffffff00;
  FederateState *this_00;
  GlobalFederateId local_d8;
  undefined6 in_stack_ffffffffffffff32;
  InterfaceHandle in_stack_ffffffffffffff3c;
  
  p_Var2 = getHandleInfo((CommonCore *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                         ,(InterfaceHandle)(BaseType)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  if (p_Var2 != (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
    modify<helics::CommonCore::setHandleOption(helics::InterfaceHandle,int,int)::__0>
              (in_stack_ffffffffffffff00,
               (anon_class_12_3_0b3fced4 *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    uVar1 = (uint16_t)
            (char)(p_Var2->
                  super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                  ._M_storage._M_storage.__data[4];
    ActionMessage::setExtraDestData
              ((ActionMessage *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    if (in_ECX != 0) {
      setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                ((ActionMessage *)&stack0xffffffffffffff18,indicator_flag);
    }
    if (((p_Var2->
         super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
         ).
         super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
         ._M_storage._M_storage.__data[4] != 'f') &&
       (in_stack_fffffffffffffee0 =
             getHandleFederate((CommonCore *)CONCAT62(in_stack_ffffffffffffff32,uVar1),
                               in_stack_ffffffffffffff3c),
       in_stack_fffffffffffffee0 != (FederateState *)0x0)) {
      this_00 = in_stack_fffffffffffffee0;
      local_d8 = std::atomic::operator_cast_to_GlobalFederateId
                           ((atomic<helics::GlobalFederateId> *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      FederateState::setProperties(this_00,(ActionMessage *)CONCAT44(in_ESI,local_d8.gid));
    }
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void CommonCore::setHandleOption(InterfaceHandle handle, int32_t option, int32_t option_value)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        return;
    }
    handles.modify([handle, option, option_value](auto& hand) {
        return hand.setHandleOption(handle, option, option_value);
    });

    ActionMessage fcn(CMD_INTERFACE_CONFIGURE);
    fcn.dest_handle = handle;
    fcn.messageID = option;
    fcn.counter = static_cast<uint16_t>(handleInfo->handleType);
    fcn.setExtraDestData(option_value);
    if (option_value != 0) {
        setActionFlag(fcn, indicator_flag);
    }
    if (handleInfo->handleType != InterfaceType::FILTER) {
        auto* fed = getHandleFederate(handle);
        if (fed != nullptr) {
            fcn.dest_id = fed->global_id;
            fed->setProperties(fcn);
        }
    } else {
        // must be for filter
    }
}